

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadTime(ON_BinaryArchive *this,tm *utc)

{
  bool bVar1;
  undefined4 uVar2;
  undefined7 extraout_var;
  undefined1 auVar3 [16];
  
  bVar1 = ReadInt(this,&utc->tm_sec);
  if (((((bVar1) && (bVar1 = ReadInt(this,&utc->tm_min), bVar1)) &&
       (bVar1 = ReadInt(this,&utc->tm_hour), bVar1)) &&
      ((bVar1 = ReadInt(this,&utc->tm_mday), bVar1 && (bVar1 = ReadInt(this,&utc->tm_mon), bVar1))))
     && ((bVar1 = ReadInt(this,&utc->tm_year), bVar1 && (bVar1 = ReadInt(this,&utc->tm_wday), bVar1)
         ))) {
    bVar1 = ReadInt(this,&utc->tm_yday);
    if (bVar1) {
      if ((((uint)utc->tm_yday < 0x16f) &&
          (auVar3._0_4_ = -(uint)(-0x7fffffc4 < (int)(utc->tm_min ^ 0x80000000U)),
          auVar3._4_4_ = -(uint)(-0x7fffffe8 < (int)(utc->tm_hour ^ 0x80000000U)),
          auVar3._8_4_ = -(uint)(-0x7fffffe1 < (int)(utc->tm_mday ^ 0x80000000U)),
          auVar3._12_4_ = -(uint)(-0x7ffffff4 < (int)(utc->tm_mon ^ 0x80000000U)),
          uVar2 = movmskps((int)CONCAT71(extraout_var,bVar1),auVar3), (char)uVar2 == '\0')) &&
         (((uint)utc->tm_wday < 8 && ((uint)utc->tm_sec < 0x3d)))) {
        return true;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x5db,"","ON_BinaryArchive::ReadTime() - bad time in archive");
      return false;
    }
  }
  return false;
}

Assistant:

bool
ON_BinaryArchive::ReadTime( struct tm& utc )
{
  // utc = coordinated universal time ( a.k.a GMT, UTC )
  // (From ANSI C time() and gmtime().)
  bool rc = ReadInt( &utc.tm_sec );
  if ( rc )
    rc = ReadInt( &utc.tm_min );
  if ( rc )
    rc = ReadInt( &utc.tm_hour );
  if ( rc )
    rc = ReadInt( &utc.tm_mday );
  if ( rc )
    rc = ReadInt( &utc.tm_mon );
  if ( rc )
    rc = ReadInt( &utc.tm_year );
  if ( rc )
    rc = ReadInt( &utc.tm_wday );
  if ( rc )
    rc = ReadInt( &utc.tm_yday );
  if ( rc ) {
    if ( utc.tm_sec < 0 || utc.tm_sec > 60 )
      rc = false;
    if ( utc.tm_min < 0 || utc.tm_min > 60 )
      rc = false;
    if ( utc.tm_hour < 0 || utc.tm_hour > 24 )
      rc = false;
    if ( utc.tm_mday < 0 || utc.tm_mday > 31 )
      rc = false;
    if ( utc.tm_mon < 0 || utc.tm_mon > 12 )
      rc = false;
    // no year restrictions because dates are used in archeological userdata
    if ( utc.tm_wday < 0 || utc.tm_wday > 7 )
      rc = false;
    if ( utc.tm_yday < 0 || utc.tm_yday > 366 )
      rc = false;
    if ( !rc ) {
      ON_ERROR("ON_BinaryArchive::ReadTime() - bad time in archive");
    }
  }
  return rc;
}